

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# njd_set_pronunciation.c
# Opt level: O1

void njd_set_pronunciation(NJD *njd)

{
  long lVar1;
  int iVar2;
  int size;
  char *pcVar3;
  size_t sVar4;
  NJDNode *pNVar5;
  char *pcVar6;
  char cVar7;
  int iVar8;
  long lVar9;
  char **ppcVar10;
  long lVar11;
  NJDNode *node;
  NJDNode *pNVar12;
  
  for (pNVar12 = njd->head; pNVar12 != (NJDNode *)0x0; pNVar12 = pNVar12->next) {
    iVar2 = NJDNode_get_mora_size(pNVar12);
    if (iVar2 == 0) {
      NJDNode_set_read(pNVar12,(char *)0x0);
      NJDNode_set_pron(pNVar12,(char *)0x0);
      pcVar3 = NJDNode_get_string(pNVar12);
      sVar4 = strlen(pcVar3);
      if (0 < (int)sVar4) {
        iVar2 = 0;
        do {
          lVar11 = 0;
          pcVar6 = anon_var_dwarf_13204b;
          do {
            lVar9 = 0;
            cVar7 = *pcVar6;
            while (cVar7 != '\0') {
              if (pcVar3[lVar9 + iVar2] != cVar7) {
                lVar9 = 0xffffffff;
                break;
              }
              lVar1 = lVar9 + 1;
              lVar9 = lVar9 + 1;
              cVar7 = pcVar6[lVar1];
            }
            iVar8 = (int)lVar9;
            if (0 < iVar8) break;
            pcVar6 = njd_set_pronunciation_list[lVar11 + 3];
            lVar11 = lVar11 + 3;
          } while (pcVar6 != (char *)0x0);
          if (iVar8 < 1) {
            iVar8 = 1;
          }
          else {
            pcVar6 = njd_set_pronunciation_list[(int)lVar11 + 1];
            NJDNode_add_read(pNVar12,pcVar6);
            NJDNode_add_pron(pNVar12,pcVar6);
            size = atoi(njd_set_pronunciation_list[(int)lVar11 + 2]);
            NJDNode_add_mora_size(pNVar12,size);
          }
          iVar2 = iVar8 + iVar2;
        } while (iVar2 < (int)sVar4);
      }
      iVar2 = NJDNode_get_mora_size(pNVar12);
      if (iVar2 != 0) {
        NJDNode_set_pos(pNVar12,anon_var_dwarf_131f85);
        NJDNode_set_pos_group1(pNVar12,(char *)0x0);
        NJDNode_set_pos_group2(pNVar12,(char *)0x0);
        NJDNode_set_pos_group3(pNVar12,(char *)0x0);
      }
      pcVar6 = NJDNode_get_orig(pNVar12);
      iVar2 = strcmp(pcVar6,"*");
      if (iVar2 == 0) {
        NJDNode_set_orig(pNVar12,pcVar3);
      }
      pcVar3 = NJDNode_get_pron(pNVar12);
      iVar2 = strcmp(pcVar3,"*");
      if (iVar2 == 0) {
        pcVar3 = NJDNode_get_string(pNVar12);
        iVar2 = strcmp(pcVar3,anon_var_dwarf_9b0 + 0x12);
        if (iVar2 == 0) {
          NJDNode_set_read(pNVar12,anon_var_dwarf_9b0 + 0x12);
          NJDNode_set_pron(pNVar12,anon_var_dwarf_9b0 + 0x12);
        }
      }
      pcVar3 = NJDNode_get_pron(pNVar12);
      iVar2 = strcmp(pcVar3,"*");
      if (iVar2 == 0) {
        NJDNode_set_read(pNVar12,anon_var_dwarf_12ed96);
        NJDNode_set_pron(pNVar12,anon_var_dwarf_12ed96);
        NJDNode_set_pos(pNVar12,anon_var_dwarf_131fcf);
      }
    }
  }
  NJD_remove_silent_node(njd);
  pNVar12 = njd->head;
  if (pNVar12 != (NJDNode *)0x0) {
    node = (NJDNode *)0x0;
    do {
      pcVar3 = NJDNode_get_pos(pNVar12);
      iVar2 = strcmp(pcVar3,anon_var_dwarf_131f85);
      if (iVar2 == 0) {
        ppcVar10 = njd_set_pronunciation_list;
        pcVar3 = anon_var_dwarf_13204b;
        do {
          ppcVar10 = ppcVar10 + 3;
          pcVar6 = NJDNode_get_string(pNVar12);
          iVar2 = strcmp(pcVar6,pcVar3);
          if (iVar2 == 0) {
            pNVar5 = pNVar12;
            if (node != (NJDNode *)0x0) {
              pcVar3 = NJDNode_get_string(pNVar12);
              NJDNode_add_string(node,pcVar3);
              pcVar3 = NJDNode_get_orig(pNVar12);
              NJDNode_add_orig(node,pcVar3);
              pcVar3 = NJDNode_get_read(pNVar12);
              NJDNode_add_read(node,pcVar3);
              pcVar3 = NJDNode_get_pron(pNVar12);
              NJDNode_add_pron(node,pcVar3);
              iVar2 = NJDNode_get_mora_size(pNVar12);
              NJDNode_add_mora_size(node,iVar2);
              NJDNode_set_pron(pNVar12,(char *)0x0);
              pNVar5 = node;
            }
            goto LAB_0016f9e6;
          }
          pcVar3 = *ppcVar10;
        } while (pcVar3 != (char *)0x0);
      }
      pNVar5 = (NJDNode *)0x0;
LAB_0016f9e6:
      pNVar12 = pNVar12->next;
      node = pNVar5;
    } while (pNVar12 != (_NJDNode *)0x0);
  }
  NJD_remove_silent_node(njd);
  pNVar12 = njd->head;
  do {
    if (pNVar12 == (NJDNode *)0x0) {
      return;
    }
    if (pNVar12->next != (NJDNode *)0x0) {
      pcVar3 = NJDNode_get_pron(pNVar12->next);
      iVar2 = strcmp(pcVar3,anon_var_dwarf_12eee0);
      if (iVar2 == 0) {
        pcVar3 = NJDNode_get_pos(pNVar12->next);
        iVar2 = strcmp(pcVar3,anon_var_dwarf_1393ad + 6);
        if (iVar2 == 0) {
          pcVar3 = NJDNode_get_pos(pNVar12);
          iVar2 = strcmp(pcVar3,anon_var_dwarf_137e45 + 3);
          if (iVar2 != 0) {
            pcVar3 = NJDNode_get_pos(pNVar12);
            iVar2 = strcmp(pcVar3,anon_var_dwarf_1393ad + 6);
            if (iVar2 != 0) goto LAB_0016fae0;
          }
          iVar2 = NJDNode_get_mora_size(pNVar12);
          if (0 < iVar2) {
            NJDNode_set_pron(pNVar12->next,anon_var_dwarf_135003 + 6);
          }
        }
      }
    }
LAB_0016fae0:
    if (pNVar12->next != (_NJDNode *)0x0) {
      pcVar3 = NJDNode_get_pos(pNVar12);
      iVar2 = strcmp(pcVar3,anon_var_dwarf_1393ad + 6);
      if (iVar2 == 0) {
        pcVar3 = NJDNode_get_string(pNVar12->next);
        iVar2 = strcmp(pcVar3,anon_var_dwarf_9b0 + 0x12);
        if (iVar2 == 0) {
          pcVar3 = NJDNode_get_string(pNVar12);
          iVar2 = strcmp(pcVar3,anon_var_dwarf_132023);
          pcVar3 = anon_var_dwarf_139355;
          if (iVar2 != 0) {
            pcVar3 = NJDNode_get_string(pNVar12);
            iVar2 = strcmp(pcVar3,anon_var_dwarf_132037);
            pcVar3 = anon_var_dwarf_139376;
            if (iVar2 != 0) goto LAB_0016fb5e;
          }
          NJDNode_set_pron(pNVar12,pcVar3 + 9);
        }
      }
    }
LAB_0016fb5e:
    pNVar12 = pNVar12->next;
  } while( true );
}

Assistant:

void njd_set_pronunciation(NJD * njd)
{
   NJDNode *node;
   const char *str;
   int i, j = 0;
   int pos;
   int len;

   for (node = njd->head; node != NULL; node = node->next) {
      if (NJDNode_get_mora_size(node) == 0) {
         NJDNode_set_read(node, NULL);
         NJDNode_set_pron(node, NULL);
         /* if the word is kana, set them as filler */
         {
            str = NJDNode_get_string(node);
            len = strlen(str);
            for (pos = 0; pos < len;) {
               for (i = 0, j = 0; njd_set_pronunciation_list[i] != NULL; i += 3) {
                  j = strtopcmp(&str[pos], njd_set_pronunciation_list[i]);
                  if (j > 0)
                     break;
               }
               if (j > 0) {
                  pos += j;
                  NJDNode_add_read(node, (char *) njd_set_pronunciation_list[i + 1]);
                  NJDNode_add_pron(node, (char *) njd_set_pronunciation_list[i + 1]);
                  NJDNode_add_mora_size(node, atoi(njd_set_pronunciation_list[i + 2]));
               } else {
                  pos++;
               }
            }
            /* if filler, overwrite pos */
            if (NJDNode_get_mora_size(node) != 0) {
               NJDNode_set_pos(node, NJD_SET_PRONUNCIATION_FILLER);
               NJDNode_set_pos_group1(node, NULL);
               NJDNode_set_pos_group2(node, NULL);
               NJDNode_set_pos_group3(node, NULL);
            }
            if (strcmp(NJDNode_get_orig(node), "*") == 0) {
               NJDNode_set_orig(node, str);
            }
         }
         /* if known symbol, set the pronunciation */
         if (strcmp(NJDNode_get_pron(node), "*") == 0) {
            for (i = 0; njd_set_pronunciation_symbol_list[i] != NULL; i += 2) {
               if (strcmp(NJDNode_get_string(node), njd_set_pronunciation_symbol_list[i]) == 0) {
                  NJDNode_set_read(node, (char *) njd_set_pronunciation_symbol_list[i + 1]);
                  NJDNode_set_pron(node, (char *) njd_set_pronunciation_symbol_list[i + 1]);
                  break;
               }
            }
         }
         /* if the word is not kana, set pause symbol */
         if (strcmp(NJDNode_get_pron(node), "*") == 0) {
            NJDNode_set_read(node, NJD_SET_PRONUNCIATION_TOUTEN);
            NJDNode_set_pron(node, NJD_SET_PRONUNCIATION_TOUTEN);
            NJDNode_set_pos(node, NJD_SET_PRONUNCIATION_KIGOU);
         }
      }
   }
   NJD_remove_silent_node(njd);

   /* chain kana sequence */
   {
      NJDNode *head_of_kana_filler_sequence = NULL;
      int find;
      for (node = njd->head; node != NULL; node = node->next) {
         if (strcmp(NJDNode_get_pos(node), NJD_SET_PRONUNCIATION_FILLER) == 0) {
            find = 0;
            for (i = 0; njd_set_pronunciation_list[i] != NULL; i += 3) {
               if (strcmp(NJDNode_get_string(node), njd_set_pronunciation_list[i]) == 0) {
                  find = 1;
                  if (head_of_kana_filler_sequence == NULL) {
                     head_of_kana_filler_sequence = node;
                  } else {
                     NJDNode_add_string(head_of_kana_filler_sequence, NJDNode_get_string(node));
                     NJDNode_add_orig(head_of_kana_filler_sequence, NJDNode_get_orig(node));
                     NJDNode_add_read(head_of_kana_filler_sequence, NJDNode_get_read(node));
                     NJDNode_add_pron(head_of_kana_filler_sequence, NJDNode_get_pron(node));
                     NJDNode_add_mora_size(head_of_kana_filler_sequence,
                                           NJDNode_get_mora_size(node));
                     NJDNode_set_pron(node, NULL);
                  }
                  break;
               }
            }
            if (find == 0) {
               head_of_kana_filler_sequence = NULL;
            }
         } else {
            head_of_kana_filler_sequence = NULL;
         }
      }
   }
   NJD_remove_silent_node(njd);

   for (node = njd->head; node != NULL; node = node->next) {
      if (node->next != NULL
          && strcmp(NJDNode_get_pron(node->next), NJD_SET_PRONUNCIATION_U) == 0
          && strcmp(NJDNode_get_pos(node->next), NJD_SET_PRONUNCIATION_JODOUSHI) == 0
          && (strcmp(NJDNode_get_pos(node), NJD_SET_PRONUNCIATION_DOUSHI) == 0
              || strcmp(NJDNode_get_pos(node), NJD_SET_PRONUNCIATION_JODOUSHI) == 0)
          && NJDNode_get_mora_size(node) > 0) {
         NJDNode_set_pron(node->next, NJD_SET_PRONUNCIATION_CHOUON);
      }
      if (node->next != NULL
          && strcmp(NJDNode_get_pos(node), NJD_SET_PRONUNCIATION_JODOUSHI) == 0
          && strcmp(NJDNode_get_string(node->next), NJD_SET_PRONUNCIATION_QUESTION) == 0) {
         if (strcmp(NJDNode_get_string(node), NJD_SET_PRONUNCIATION_DESU_STR) == 0)
            NJDNode_set_pron(node, NJD_SET_PRONUNCIATION_DESU_PRON);
         else if (strcmp(NJDNode_get_string(node), NJD_SET_PRONUNCIATION_MASU_STR) == 0)
            NJDNode_set_pron(node, NJD_SET_PRONUNCIATION_MASU_PRON);
      }
   }
}